

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

bool llvm::itaniumFindTypesInMangledName
               (char *MangledName,void *Ctx,_func_void_void_ptr_char_ptr *Callback)

{
  size_t sVar1;
  Node *pNVar2;
  undefined1 local_1328 [8];
  Db Parser;
  _func_void_void_ptr_char_ptr *Callback_local;
  void *Ctx_local;
  char *MangledName_local;
  
  sVar1 = strlen(MangledName);
  anon_unknown.dwarf_4161a3::Db::Db((Db *)local_1328,MangledName,MangledName + sVar1);
  Parser.ForwardTemplateRefs.Inline[3] = (ForwardTemplateReference *)Callback;
  Parser.TypeCallback = (_func_void_void_ptr_char_ptr *)Ctx;
  pNVar2 = anon_unknown.dwarf_4161a3::Db::parse((Db *)local_1328);
  anon_unknown.dwarf_4161a3::Db::~Db((Db *)local_1328);
  return pNVar2 == (Node *)0x0;
}

Assistant:

bool llvm::itaniumFindTypesInMangledName(const char *MangledName, void *Ctx,
                                         void (*Callback)(void *,
                                                          const char *)) {
  Db Parser(MangledName, MangledName + std::strlen(MangledName));
  Parser.TypeCallback = Callback;
  Parser.TypeCallbackContext = Ctx;
  return Parser.parse() == nullptr;
}